

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O3

void deqp::gles3::Functional::FboTestUtil::clearColorBuffer
               (Context *ctx,TextureFormat *format,Vec4 *value)

{
  TextureChannelClass TVar1;
  Vector<unsigned_int,_4> res;
  
  TVar1 = tcu::getTextureChannelClass(format->type);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    (*ctx->_vptr_Context[0x2f])(ctx,0x1800,0,value);
    return;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    (*ctx->_vptr_Context[0x2e])(ctx,0x1800,0);
    break;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    (*ctx->_vptr_Context[0x30])(ctx,0x1800,0);
  }
  return;
}

Assistant:

void clearColorBuffer (sglr::Context& ctx, const tcu::TextureFormat& format, const tcu::Vec4& value)
{
	const tcu::TextureChannelClass fmtClass = tcu::getTextureChannelClass(format.type);

	switch (fmtClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			ctx.clearBufferfv(GL_COLOR, 0, value.getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			ctx.clearBufferuiv(GL_COLOR, 0, value.asUint().getPtr());
			break;

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			ctx.clearBufferiv(GL_COLOR, 0, value.asInt().getPtr());
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}
}